

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5StorageIndexInsert(Fts5Storage *p,sqlite3_value **apVal,i64 iRowid)

{
  Fts5Config *pFVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  int rc;
  Fts5Buffer buf;
  int local_5c;
  Fts5Storage *local_58;
  int local_50;
  int local_4c;
  Fts5Buffer local_48;
  i64 local_38;
  
  pFVar1 = p->pConfig;
  local_5c = 0;
  local_48.p = (u8 *)0x0;
  local_48.n = 0;
  local_48.nSpace = 0;
  local_58 = p;
  local_5c = fts5StorageLoadTotals(p,1);
  if (local_5c == 0) {
    local_5c = sqlite3Fts5IndexBeginWrite(p->pIndex,0,iRowid);
  }
  local_50 = 0;
  bVar4 = local_5c == 0;
  local_38 = iRowid;
  if (bVar4) {
    if (0 < pFVar1->nCol) {
      do {
        local_4c = 0;
        if (pFVar1->abUnindexed[local_50] == '\0') {
          pcVar3 = (char *)sqlite3ValueText(apVal[(long)local_50 + 2],'\x01');
          iVar2 = sqlite3ValueBytes(apVal[(long)local_50 + 2],'\x01');
          if (pcVar3 == (char *)0x0) {
            local_5c = 0;
          }
          else {
            local_5c = (*pFVar1->pTokApi->xTokenize)
                                 (pFVar1->pTok,&local_58,4,pcVar3,iVar2,fts5StorageInsertCallback);
          }
        }
        sqlite3Fts5BufferAppendVarint(&local_5c,&local_48,(long)local_4c);
        p->aTotalSize[local_50] = p->aTotalSize[local_50] + (long)local_4c;
        local_50 = local_50 + 1;
        bVar4 = local_5c == 0;
        if (!bVar4) goto LAB_001d1cee;
      } while (local_50 < pFVar1->nCol);
    }
    p->nTotalRow = p->nTotalRow + 1;
    if (bVar4) {
      local_5c = fts5StorageInsertDocsize(p,local_38,&local_48);
    }
  }
  else {
LAB_001d1cee:
    p->nTotalRow = p->nTotalRow + 1;
  }
  sqlite3_free(local_48.p);
  return local_5c;
}

Assistant:

static int sqlite3Fts5StorageIndexInsert(
  Fts5Storage *p, 
  sqlite3_value **apVal, 
  i64 iRowid
){
  Fts5Config *pConfig = p->pConfig;
  int rc = SQLITE_OK;             /* Return code */
  Fts5InsertCtx ctx;              /* Tokenization callback context object */
  Fts5Buffer buf;                 /* Buffer used to build up %_docsize blob */

  memset(&buf, 0, sizeof(Fts5Buffer));
  ctx.pStorage = p;
  rc = fts5StorageLoadTotals(p, 1);

  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexBeginWrite(p->pIndex, 0, iRowid);
  }
  for(ctx.iCol=0; rc==SQLITE_OK && ctx.iCol<pConfig->nCol; ctx.iCol++){
    ctx.szCol = 0;
    if( pConfig->abUnindexed[ctx.iCol]==0 ){
      rc = sqlite3Fts5Tokenize(pConfig, 
          FTS5_TOKENIZE_DOCUMENT,
          (const char*)sqlite3_value_text(apVal[ctx.iCol+2]),
          sqlite3_value_bytes(apVal[ctx.iCol+2]),
          (void*)&ctx,
          fts5StorageInsertCallback
      );
    }
    sqlite3Fts5BufferAppendVarint(&rc, &buf, ctx.szCol);
    p->aTotalSize[ctx.iCol] += (i64)ctx.szCol;
  }
  p->nTotalRow++;

  /* Write the %_docsize record */
  if( rc==SQLITE_OK ){
    rc = fts5StorageInsertDocsize(p, iRowid, &buf);
  }
  sqlite3_free(buf.p);

  return rc;
}